

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
::remove_last(Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
              *this)

{
  Dictionary *this_00;
  pointer *ppPVar1;
  Column_container *this_01;
  pointer puVar2;
  pointer puVar3;
  iterator iVar4;
  iterator iVar5;
  pointer puVar6;
  pointer puVar7;
  Index IVar8;
  ID_index rowID;
  key_type local_24;
  
  if (this->nextInsertIndex_ == 0) {
    IVar8 = 0xffffffff;
  }
  else {
    this->nextInsertIndex_ = this->nextInsertIndex_ - 1;
    this_01 = &this->matrix_;
    iVar4 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_01->_M_h,&this->nextInsertIndex_);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    puVar2 = (this->super_Matrix_dimension_option).dimensions_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2[*(uint *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_false>
                           ._M_cur + 0x20)] =
         puVar2[*(uint *)((long)iVar4.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_false>
                                ._M_cur + 0x20)] - 1;
    puVar3 = (this->super_Matrix_dimension_option).dimensions_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while ((puVar7 = puVar2, puVar2 != puVar3 &&
           (puVar6 = puVar3 + -1, puVar7 = puVar3, *puVar6 == 0))) {
      (this->super_Matrix_dimension_option).dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
      puVar3 = puVar6;
    }
    (this->super_Matrix_dimension_option).maxDim_ =
         (int)((ulong)((long)puVar7 - (long)puVar2) >> 2) + -1;
    iVar4 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_01->_M_h,&this->nextInsertIndex_);
    IVar8 = 0xffffffff;
    if (*(long *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_false>
                        ._M_cur + 0x38) !=
        (long)iVar4.
              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_false>
              ._M_cur + 0x38 &&
        *(long *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_false>
                        ._M_cur + 0x38) != 0) {
      IVar8 = *(Index *)(*(long *)((long)iVar4.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_false>
                                         ._M_cur + 0x40) + 0x10);
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&this_01->_M_h,
            (const_iterator)
            iVar4.
            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_false>
            ._M_cur);
    Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>_>_>_>,_true,_unsigned_int>
    ::erase_empty_row(&this->super_Matrix_row_access_option,this->nextInsertIndex_);
    if ((this->super_Base_pairing_option).isReduced_ == true) {
      this_00 = &(this->super_Base_pairing_option).deathToBar_;
      iVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,&local_24);
      if (iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          == (__node_type *)0x0) {
        ppPVar1 = &(this->super_Base_pairing_option).barcode_.
                   super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + -1;
      }
      else {
        (this->super_Base_pairing_option).barcode_.
        super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start
        [*(uint *)((long)iVar5.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                         ._M_cur + 0xc)].death = 0xffffffff;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&this_00->_M_h,
                (const_iterator)
                iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                _M_cur);
      }
    }
    iVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&this->super_Base_pairing_option,&local_24);
    if (iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        != (__node_type *)0x0) {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->super_Base_pairing_option).idToPosition_._M_h,
                 (long)iVar5.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur + 0xc);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&this->super_Base_pairing_option,
              (const_iterator)
              iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur);
    }
  }
  return IVar8;
}

Assistant:

inline typename Boundary_matrix<Master_matrix>::Index Boundary_matrix<Master_matrix>::remove_last()
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'remove_last' is not implemented for the chosen options.");

  if (nextInsertIndex_ == 0) return Master_matrix::template get_null_value<Index>();  // empty matrix
  --nextInsertIndex_;

  //updates dimension max
  if constexpr (activeDimOption) {
    Dim_opt::update_down(matrix_.at(nextInsertIndex_).get_dimension());
  }

  //computes pivot and removes column from matrix_
  ID_index pivot;
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    auto it = matrix_.find(nextInsertIndex_);
    pivot = it->second.get_pivot();
    if constexpr (activeSwapOption) {
      // if the removed column is positive, the pivot won't change value
      if (Swap_opt::rowSwapped_ && pivot != Master_matrix::template get_null_value<ID_index>()) {
        Swap_opt::_orderRows();
        pivot = it->second.get_pivot();
      }
    }
    matrix_.erase(it);
  } else {
    pivot = matrix_[nextInsertIndex_].get_pivot();
    if constexpr (activeSwapOption) {
      // if the removed column is positive, the pivot won't change value
      if (Swap_opt::rowSwapped_ && pivot != Master_matrix::template get_null_value<ID_index>()) {
        Swap_opt::_orderRows();
        pivot = matrix_[nextInsertIndex_].get_pivot();
      }
    }
    if constexpr (Master_matrix::Option_list::has_row_access) {
      GUDHI_CHECK(nextInsertIndex_ == matrix_.size() - 1,
                  std::logic_error("Boundary_matrix::remove_last - Indexation problem."));
      matrix_.pop_back();
    } else {
      matrix_[nextInsertIndex_].clear();
    }
  }

  erase_empty_row(nextInsertIndex_);  // maximal, so empty

  //updates barcode
  if constexpr (activePairingOption) {
    Pair_opt::_remove_last(nextInsertIndex_);
  }

  return pivot;
}